

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O0

void __thiscall Mems::save_mirrors_with_samples_2(Mems *this,string *input)

{
  bool bVar1;
  ostream *poVar2;
  pointer pMVar3;
  pointer pPVar4;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> local_258;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> local_250;
  iterator sam;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_240;
  iterator mi;
  string local_228 [8];
  fstream f;
  ostream local_218 [512];
  string *local_18;
  string *input_local;
  Mems *this_local;
  
  local_18 = input;
  input_local = (string *)this;
  std::fstream::fstream(local_228);
  std::fstream::open(local_228,(_Ios_Openmode)input);
  local_240._M_current =
       (Mirror *)
       std::vector<Mirror,_std::allocator<Mirror>_>::begin(&this->_mems_mirrors_randomrasterized);
  while( true ) {
    sam._M_current =
         (Point_d *)
         std::vector<Mirror,_std::allocator<Mirror>_>::end(&this->_mems_mirrors_randomrasterized);
    bVar1 = __gnu_cxx::operator!=
                      (&local_240,
                       (__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> *
                       )&sam);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_218,"id ");
    pMVar3 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_240);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pMVar3->id);
    std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(local_218,"pos ");
    pMVar3 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_240);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pMVar3->_position).x);
    poVar2 = std::operator<<(poVar2," ");
    pMVar3 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_240);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pMVar3->_position).y);
    poVar2 = std::operator<<(poVar2," ");
    pMVar3 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_240);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pMVar3->_position).dis);
    std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(local_218,"dis_sample ");
    pMVar3 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_240);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pMVar3->_displayed_sample).x);
    poVar2 = std::operator<<(poVar2," ");
    pMVar3 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_240);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pMVar3->_displayed_sample).y);
    poVar2 = std::operator<<(poVar2," ");
    pMVar3 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_240);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pMVar3->_displayed_sample).dis);
    std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(local_218,"sample_ammount ");
    pMVar3 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_240);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pMVar3->_ammount_of_matching_samples);
    std::operator<<(poVar2,";\n");
    pMVar3 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_240);
    local_250._M_current =
         (Point_d *)
         std::vector<Point_d,_std::allocator<Point_d>_>::begin(&pMVar3->_matching_samples);
    while( true ) {
      pMVar3 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>
               ::operator->(&local_240);
      local_258._M_current =
           (Point_d *)
           std::vector<Point_d,_std::allocator<Point_d>_>::end(&pMVar3->_matching_samples);
      bVar1 = __gnu_cxx::operator!=(&local_250,&local_258);
      if (!bVar1) break;
      poVar2 = std::operator<<(local_218,"pos ");
      pPVar4 = __gnu_cxx::
               __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
               operator->(&local_250);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pPVar4->x);
      poVar2 = std::operator<<(poVar2," ");
      pPVar4 = __gnu_cxx::
               __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
               operator->(&local_250);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pPVar4->y);
      poVar2 = std::operator<<(poVar2," ");
      pPVar4 = __gnu_cxx::
               __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
               operator->(&local_250);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pPVar4->dis);
      std::operator<<(poVar2,";\n");
      __gnu_cxx::__normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
      operator++(&local_250);
    }
    poVar2 = std::operator<<(local_218,"--- ");
    std::operator<<(poVar2,";\n");
    __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
    operator++(&local_240);
  }
  std::fstream::close();
  std::fstream::~fstream(local_228);
  return;
}

Assistant:

void Mems::save_mirrors_with_samples_2(std::string input){
    std::fstream f;
    f.open(input, std::ios::out);
    for(auto mi = _mems_mirrors_randomrasterized.begin(); mi!= _mems_mirrors_randomrasterized.end(); ++mi){
        f << "id " << mi->id<< ";\n";
        f << "pos " << mi->_position.x<< " "<< mi->_position.y<< " "<< mi->_position.dis<< ";\n";
        f << "dis_sample " << mi->_displayed_sample.x<< " "<< mi->_displayed_sample.y<< " "<< mi->_displayed_sample.dis<< ";\n";
        f << "sample_ammount " << mi->_ammount_of_matching_samples<< ";\n";
        for(auto sam = mi->_matching_samples.begin(); sam!=mi->_matching_samples.end(); ++sam){
          f << "pos " <<sam->x<< " "<< sam->y<< " "<< sam->dis<< ";\n";
        }
        f << "--- " << ";\n";
      }
      f.close();
    }